

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriterState<signed_char,_int,_duckdb::ParquetCastOperator>::
StandardColumnWriterState
          (StandardColumnWriterState<signed_char,_int,_duckdb::ParquetCastOperator> *this,
          ParquetWriter *writer,RowGroup *row_group,idx_t col_idx)

{
  Allocator *allocator_p;
  
  PrimitiveColumnWriterState::PrimitiveColumnWriterState
            (&this->super_PrimitiveColumnWriterState,writer,row_group,col_idx);
  (this->super_PrimitiveColumnWriterState).super_ColumnWriterState._vptr_ColumnWriterState =
       (_func_int **)&PTR__StandardColumnWriterState_024cd840;
  this->total_value_count = 0;
  this->total_string_size = 0;
  this->key_bit_width = 0;
  allocator_p = BufferAllocator::Get(writer->context);
  PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator>::PrimitiveDictionary
            (&this->dictionary,allocator_p,writer->dictionary_size_limit,
             writer->string_dictionary_page_size_limit);
  this->encoding = PLAIN;
  return;
}

Assistant:

StandardColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : PrimitiveColumnWriterState(writer, row_group, col_idx),
	      dictionary(BufferAllocator::Get(writer.GetContext()), writer.DictionarySizeLimit(),
	                 writer.StringDictionaryPageSizeLimit()),
	      encoding(duckdb_parquet::Encoding::PLAIN) {
	}